

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool CompareColors(int *rgbBG,int *rgbFG)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool local_29;
  int diffColor;
  int diffBright;
  int brightFG;
  int brightBG;
  int *rgbFG_local;
  int *rgbBG_local;
  
  iVar1 = brightness(rgbBG);
  iVar2 = brightness(rgbFG);
  iVar1 = minmax(iVar1,iVar2);
  iVar2 = minmax(*rgbBG,*rgbFG);
  iVar3 = minmax(rgbBG[1],rgbFG[1]);
  iVar4 = minmax(rgbBG[2],rgbFG[2]);
  local_29 = 0xb4 < iVar1 && 500 < iVar2 + iVar3 + iVar4;
  return (Bool)local_29;
}

Assistant:

static Bool CompareColors( const int rgbBG[3], const int rgbFG[3] )
{
    int brightBG = brightness( rgbBG );
    int brightFG = brightness( rgbFG );

    int diffBright = minmax( brightBG, brightFG );

    int diffColor = minmax( rgbBG[0], rgbFG[0] )
                  + minmax( rgbBG[1], rgbFG[1] )
                  + minmax( rgbBG[2], rgbFG[2] );

    return ( diffBright > 180 &&
             diffColor > 500 );
}